

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Stop(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  APlayerPawn *this;
  player_t *ppVar1;
  bool bVar2;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (APlayerPawn *)(param->field_0).field_1.a;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (bVar2) {
      (this->super_AActor).Vel.Z = 0.0;
      (this->super_AActor).Vel.X = 0.0;
      (this->super_AActor).Vel.Y = 0.0;
      ppVar1 = (this->super_AActor).player;
      if (((ppVar1 != (player_t *)0x0) && (ppVar1->mo == this)) && ((ppVar1->cheats & 0x2000) == 0))
      {
        APlayerPawn::PlayIdle(ppVar1->mo);
        ppVar1 = (this->super_AActor).player;
        (ppVar1->Vel).X = 0.0;
        (ppVar1->Vel).Y = 0.0;
      }
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xecf,"int AF_AActor_A_Stop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Stop)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->Vel.Zero();
	if (self->player && self->player->mo == self && !(self->player->cheats & CF_PREDICTING))
	{
		self->player->mo->PlayIdle();
		self->player->Vel.Zero();
	}
	return 0;
}